

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgm_overlay.cpp
# Opt level: O2

MatchResult __thiscall r_exec::PGMOverlay::match(PGMOverlay *this,View *input,uint16_t *input_index)

{
  atomic_int_fast64_t *paVar1;
  list<unsigned_short> *this_00;
  MatchResult MVar2;
  long lVar3;
  byte bVar4;
  const_iterator local_48;
  uint16_t *local_38;
  
  if (input != (View *)0x0) {
    LOCK();
    paVar1 = &(input->super_View).super__Object.refCount;
    (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
    UNLOCK();
  }
  local_48.super__iterator._cell = (int64_t)input;
  local_38 = input_index;
  std::vector<core::P<r_code::View>,std::allocator<core::P<r_code::View>>>::
  emplace_back<core::P<r_code::View>>
            ((vector<core::P<r_code::View>,std::allocator<core::P<r_code::View>>> *)
             &this->input_views,(P<r_code::View> *)&local_48);
  core::P<r_code::View>::~P((P<r_code::View> *)&local_48);
  this_00 = &this->input_pattern_indices;
  lVar3 = (this->input_pattern_indices).used_cells_head;
  bVar4 = 0;
  local_48._list = this_00;
  do {
    local_48.super__iterator._cell = lVar3;
    if (lVar3 == -1) {
      std::vector<core::P<r_code::View>,_std::allocator<core::P<r_code::View>_>_>::pop_back
                (&this->input_views);
      return ((byte)~bVar4 & 1) * 2 + FAILURE;
    }
    MVar2 = _match(this,input,
                   (this->input_pattern_indices).cells.
                   super__Vector_base<r_code::list<unsigned_short>::cell,_std::allocator<r_code::list<unsigned_short>::cell>_>
                   ._M_impl.super__Vector_impl_data._M_start[lVar3].data);
    if (MVar2 == FAILURE) {
      Overlay::rollback((Overlay *)this);
      bVar4 = 1;
    }
    else if (MVar2 == SUCCESS) {
      *local_38 = (this_00->cells).
                  super__Vector_base<r_code::list<unsigned_short>::cell,_std::allocator<r_code::list<unsigned_short>::cell>_>
                  ._M_impl.super__Vector_impl_data._M_start[lVar3].data;
      r_code::list<unsigned_short>::erase(this_00,&local_48);
      return SUCCESS;
    }
    lVar3 = (this_00->cells).
            super__Vector_base<r_code::list<unsigned_short>::cell,_std::allocator<r_code::list<unsigned_short>::cell>_>
            ._M_impl.super__Vector_impl_data._M_start[lVar3].next;
  } while( true );
}

Assistant:

PGMOverlay::MatchResult PGMOverlay::match(r_exec::View *input, uint16_t &input_index)
{
    input_views.push_back(input);
    bool failed = false;
    r_code::list<uint16_t>::const_iterator it;

    for (it = input_pattern_indices.begin(); it != input_pattern_indices.end(); ++it) {
        MatchResult r = _match(input, *it);

        switch (r) {
        case SUCCESS:
            input_index = *it;
            input_pattern_indices.erase(it);
            return r;

        case FAILURE:
            failed = true;
            rollback(); // to try another pattern on a clean basis.

        case IMPOSSIBLE:
            break;
        }
    }

    input_views.pop_back();
    return failed ? FAILURE : IMPOSSIBLE;
}